

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjuliancalendar.cpp
# Opt level: O2

YearMonthDay __thiscall QJulianCalendar::julianDayToDate(QJulianCalendar *this,qint64 jd)

{
  int iVar1;
  R_conflict15 RVar2;
  R_conflict20 RVar3;
  YearMonthDay YVar4;
  
  RVar2 = QRoundingDown::qDivMod<1461U,_long_long,_true>(jd * 4 + -0x690c75);
  RVar3 = QRomanCalendrical::dayInYearToYmd((int)((ulong)RVar2.remainder >> 2));
  YVar4.day = RVar3.day;
  iVar1 = (int)RVar2.quotient + RVar3.year;
  YVar4._0_8_ = RVar3._0_8_ & 0xffffffff00000000 | (ulong)(iVar1 - (uint)(iVar1 < 1));
  return YVar4;
}

Assistant:

QCalendar::YearMonthDay QJulianCalendar::julianDayToDate(qint64 jd) const
{
    const auto year4Day = qDivMod<FourYears>(4 * (jd - JulianBaseJd) - 1);
    // Its remainder changes by 4 per day, except at roughly yearly quotient steps.
    const auto ymd = dayInYearToYmd(qDiv<4>(year4Day.remainder));
    const int y = year4Day.quotient + ymd.year;
    return QCalendar::YearMonthDay(y > 0 ? y : y - 1, ymd.month, ymd.day);
}